

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestFilter_invertMatching_TestShell::createTest(TEST_TestFilter_invertMatching_TestShell *this)

{
  Utest *this_00;
  TEST_TestFilter_invertMatching_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFilterTest.cpp"
                                  ,0x3c);
  TEST_TestFilter_invertMatching_Test::TEST_TestFilter_invertMatching_Test
            ((TEST_TestFilter_invertMatching_Test *)this_00);
  return this_00;
}

Assistant:

TEST(TestFilter, invertMatching)
{
    TestFilter filter("filter");
    filter.invertMatching();
    CHECK(!filter.match("filter"));
    CHECK(!filter.match("filterr"));
    CHECK(filter.match("notevenclose"));
    CHECK(filter.match(""));
}